

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eve.cpp
# Opt level: O2

void eve::emitevents(OASIS_INT pno_,OASIS_INT total_,vector<int,_std::allocator<int>_> *events,
                    bool textmode)

{
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  undefined4 uStack_38;
  int eventid;
  
  uVar3 = (ulong)((long)(events->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(events->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  uVar3 = (ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff;
  iVar5 = (int)((long)uVar3 % (long)total_);
  iVar4 = iVar5 + 1;
  iVar1 = (int)((long)uVar3 / (long)total_);
  iVar2 = pno_;
  if (iVar4 < pno_) {
    iVar2 = iVar4;
  }
  iVar6 = -(iVar4 - pno_);
  if (-1 < iVar4 - pno_) {
    iVar6 = 0;
  }
  if (pno_ + 1 < iVar4) {
    iVar4 = pno_ + 1;
  }
  iVar5 = pno_ - iVar5;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  _uStack_38 = in_RAX;
  for (lVar7 = (long)(iVar6 * iVar1 + (iVar2 + -1) * (iVar1 + 1));
      lVar7 < iVar5 * iVar1 + (iVar4 + -1) * (iVar1 + 1); lVar7 = lVar7 + 1) {
    _uStack_38 = CONCAT44((events->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[lVar7],uStack_38);
    if (textmode) {
      fprintf(_stdout,"%d\n");
    }
    else {
      fwrite(&eventid,4,1,_stdout);
    }
  }
  return;
}

Assistant:

void emitevents(OASIS_INT pno_, OASIS_INT total_, std::vector<int> &events,
                    bool textmode) {

	int total_events = (int)events.size();
	int min_chunksize = total_events / total_;
	int first_min_pno = (total_events % total_) + 1;
	int start_pos = (min_chunksize + 1) * (std::min(first_min_pno, pno_) - 1);
	start_pos += min_chunksize * std::max(pno_ - first_min_pno, 0);
	int end_pos = (min_chunksize + 1) * (std::min(first_min_pno, pno_+1) - 1);
	end_pos += min_chunksize * std::max(pno_+1 - first_min_pno, 0);

        while (start_pos < end_pos) {
            int eventid = events[start_pos];
            if (textmode == true)
                fprintf(stdout, "%d\n", eventid);
            else
                fwrite(&eventid, sizeof(eventid), 1, stdout);
            start_pos++;
        }
    }